

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_encoder.cc
# Opt level: O1

Status * __thiscall
draco::StlEncoder::EncodeToBuffer
          (Status *__return_storage_ptr__,StlEncoder *this,Mesh *mesh,EncoderBuffer *out_buffer)

{
  this->in_mesh_ = mesh;
  this->out_buffer_ = out_buffer;
  EncodeInternal(__return_storage_ptr__,this);
  this->out_buffer_ = (EncoderBuffer *)0x0;
  this->in_point_cloud_ = (PointCloud *)0x0;
  this->in_mesh_ = (Mesh *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Status StlEncoder::EncodeToBuffer(const Mesh &mesh, EncoderBuffer *out_buffer) {
  in_mesh_ = &mesh;
  out_buffer_ = out_buffer;
  Status s = EncodeInternal();
  in_mesh_ = nullptr;  // cleanup
  in_point_cloud_ = nullptr;
  out_buffer_ = nullptr;
  return s;
}